

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::PoolingLayerParams::MergeFrom
          (PoolingLayerParams *this,PoolingLayerParams *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  ValidPadding *this_00;
  ValidPadding *from_00;
  SamePadding *this_01;
  SamePadding *from_01;
  PoolingLayerParams_ValidCompletePadding *this_02;
  PoolingLayerParams_ValidCompletePadding *from_02;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x7f90);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(&this->kernelsize_,&from->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(&this->stride_,&from->stride_);
  if (from->type_ != 0) {
    this->type_ = from->type_;
  }
  if (from->avgpoolexcludepadding_ == true) {
    this->avgpoolexcludepadding_ = true;
  }
  if (from->globalpooling_ == true) {
    this->globalpooling_ = true;
  }
  uVar1 = from->_oneof_case_[0];
  if (uVar1 == 0x20) {
    this_02 = mutable_includelastpixel(this);
    from_02 = includelastpixel(from);
    PoolingLayerParams_ValidCompletePadding::MergeFrom(this_02,from_02);
  }
  else if (uVar1 == 0x1f) {
    this_01 = mutable_same(this);
    from_01 = same(from);
    SamePadding::MergeFrom(this_01,from_01);
  }
  else if (uVar1 == 0x1e) {
    this_00 = mutable_valid(this);
    from_00 = valid(from);
    ValidPadding::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void PoolingLayerParams::MergeFrom(const PoolingLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.PoolingLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  kernelsize_.MergeFrom(from.kernelsize_);
  stride_.MergeFrom(from.stride_);
  if (from.type() != 0) {
    set_type(from.type());
  }
  if (from.avgpoolexcludepadding() != 0) {
    set_avgpoolexcludepadding(from.avgpoolexcludepadding());
  }
  if (from.globalpooling() != 0) {
    set_globalpooling(from.globalpooling());
  }
  switch (from.PoolingPaddingType_case()) {
    case kValid: {
      mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from.valid());
      break;
    }
    case kSame: {
      mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from.same());
      break;
    }
    case kIncludeLastPixel: {
      mutable_includelastpixel()->::CoreML::Specification::PoolingLayerParams_ValidCompletePadding::MergeFrom(from.includelastpixel());
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
}